

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O0

void __thiscall r_exec::CSTController::check_last_match_time(CSTController *this,bool match)

{
  uint64_t uVar1;
  uint64_t uVar2;
  _Mem *this_00;
  uint64_t uVar3;
  uint64_t now;
  bool match_local;
  CSTController *this_local;
  
  uVar2 = (*Now)();
  if (match) {
    (this->super_HLPController).last_match_time = uVar2;
  }
  else {
    uVar1 = (this->super_HLPController).last_match_time;
    this_00 = _Mem::Get();
    uVar3 = _Mem::get_primary_thz(this_00);
    if (uVar3 < uVar2 - uVar1) {
      (*(this->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object
        [7])();
    }
  }
  return;
}

Assistant:

void CSTController::check_last_match_time(bool match)
{
    uint64_t now = Now();

    if (match) {
        last_match_time = now;
    } else if (now - last_match_time > _Mem::Get()->get_primary_thz()) {
        kill_views();
    }
}